

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_64x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar14;
  ushort uVar16;
  ushort uVar17;
  undefined1 auVar9 [16];
  ushort uVar18;
  undefined1 auVar10 [16];
  __m128i row;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 uVar13;
  byte bVar15;
  
  auVar9 = psadbw(*(undefined1 (*) [16])left,(undefined1  [16])0x0);
  auVar6 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(left + 0x10));
  auVar7._0_2_ = auVar6._0_2_ + auVar9._0_2_;
  auVar7._2_2_ = auVar6._2_2_ + auVar9._2_2_;
  auVar7._4_2_ = auVar6._4_2_ + auVar9._4_2_;
  auVar7._6_2_ = auVar6._6_2_ + auVar9._6_2_;
  auVar7._8_2_ = auVar6._8_2_ + auVar9._8_2_;
  auVar7._10_2_ = auVar6._10_2_ + auVar9._10_2_;
  auVar7._12_2_ = auVar6._12_2_ + auVar9._12_2_;
  auVar7._14_2_ = auVar6._14_2_ + auVar9._14_2_;
  uVar8 = auVar7._8_2_ + auVar7._0_2_ + 0x10;
  uVar14 = auVar7._10_2_ + auVar7._2_2_ + 0x10;
  uVar16 = auVar7._12_2_ + auVar7._4_2_ + 0x10;
  uVar17 = auVar7._14_2_ + auVar7._6_2_ + 0x10;
  auVar9._0_2_ = uVar8 >> 5;
  uVar18 = uVar17 >> 5;
  uVar1 = CONCAT22((ushort)(auVar7._8_2_ * 2 + 0x10U) >> 5,uVar18);
  auVar10._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar7._10_2_ * 2 + 0x10U) >> 5,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar11._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar7._12_2_ * 2 + 0x10U) >> 5,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar12._0_13_ = auVar5 << 0x30;
  bVar15 = (byte)(uVar17 >> 8);
  auVar12._14_2_ = (undefined2)(CONCAT19(bVar15 >> 5,CONCAT18(bVar15 >> 5,uVar3)) >> 0x40);
  auVar12[0xd] = (char)uVar18;
  bVar15 = (byte)(uVar16 >> 0xd);
  auVar11._12_4_ = (undefined4)(CONCAT37(auVar12._13_3_,CONCAT16((char)uVar18,uVar2)) >> 0x30);
  auVar11[0xb] = bVar15;
  uVar13 = (undefined1)(uVar16 >> 5);
  auVar10._10_6_ = (undefined6)(CONCAT55(auVar11._11_5_,CONCAT14(bVar15,uVar1)) >> 0x20);
  auVar10[9] = uVar13;
  bVar15 = (byte)(uVar14 >> 0xd);
  auVar9._8_8_ = (undefined8)(CONCAT73(auVar10._9_7_,CONCAT12(uVar13,uVar18)) >> 0x10);
  auVar9[7] = bVar15;
  auVar9[6] = bVar15;
  uVar13 = (undefined1)(uVar14 >> 5);
  auVar9[5] = uVar13;
  auVar9[4] = uVar13;
  bVar15 = (byte)(uVar8 >> 8);
  auVar9[3] = bVar15 >> 5;
  auVar9[2] = bVar15 >> 5;
  auVar6[0] = (undefined1)auVar9._0_2_;
  auVar6._2_14_ = auVar9._2_14_;
  auVar6[1] = auVar6[0];
  auVar6 = pshuflw(auVar7,auVar6,0);
  row[0]._0_4_ = auVar6._0_4_;
  row[0]._4_4_ = (undefined4)row[0];
  row[1]._0_4_ = (undefined4)row[0];
  row[1]._4_4_ = (undefined4)row[0];
  dc_store_64xh(&row,0x20,dst,stride);
  return;
}

Assistant:

void aom_dc_left_predictor_64x32_sse2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above,
                                      const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_32_sse2(left);
  const __m128i sixteen = _mm_set1_epi16(16);
  sum_left = _mm_add_epi16(sum_left, sixteen);
  sum_left = _mm_srai_epi16(sum_left, 5);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_64xh(&row, 32, dst, stride);
}